

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cc
# Opt level: O3

ostream * __thiscall tchecker::ite_expression_t::output(ite_expression_t *this,ostream *os)

{
  element_type *peVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"if ",3);
  peVar1 = (this->_condition).
           super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_expression_t[4])(peVar1,os);
  std::__ostream_insert<char,std::char_traits<char>>(os," then ",6);
  peVar1 = (this->_then_value).
           super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_expression_t[4])(peVar1,os);
  std::__ostream_insert<char,std::char_traits<char>>(os," else ",6);
  peVar1 = (this->_else_value).
           super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_expression_t[4])(peVar1,os);
  return os;
}

Assistant:

std::ostream & ite_expression_t::output(std::ostream & os) const
{
  os << "if ";
  condition().output(os);
  os << " then ";
  then_value().output(os);
  os << " else ";
  else_value().output(os);
  return os;
}